

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

void SetTiming(int onoff,int myid)

{
  int iVar1;
  timespec spec;
  timespec local_28;
  
  clock_gettime(1,&local_28);
  base_time_tv_sec = local_28.tv_sec;
  clock_getres(1,&local_28);
  iVar1 = 0;
  if (myid == 0) {
    printf("Timer resolution: %ld ns = %g s\n",(double)local_28.tv_nsec / 1000000000.0);
    iVar1 = onoff;
  }
  print_time = iVar1;
  return;
}

Assistant:

void SetTiming(int onoff, int myid)
{
#if defined(SUNDIALS_HAVE_POSIX_TIMERS) && defined(_POSIX_TIMERS)
  struct timespec spec;
  clock_gettime(CLOCK_MONOTONIC, &spec);
  base_time_tv_sec = spec.tv_sec;

  clock_getres(CLOCK_MONOTONIC, &spec);
  if (myid == 0)
  {
    printf("Timer resolution: %ld ns = %g s\n", spec.tv_nsec,
           ((double)(spec.tv_nsec) / 1E9));
  }
#endif

  /* only print from the root process */
  print_time = (myid == 0) ? onoff : 0;
}